

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

bool __thiscall QObject::isSignalConnected(QObject *this,QMetaMethod *signal)

{
  QBasicMutex *this_00;
  __pointer_type copy;
  QObjectPrivate *this_01;
  QMetaObject *pQVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  if (signal->mobj == (QMetaObject *)0x0) {
    return false;
  }
  this_01 = (QObjectPrivate *)(this->d_ptr).d;
  iVar2 = QMetaMethod::relativeMethodIndex(signal);
  if (((signal->data).d[4] & 0x20) != 0) {
    iVar2 = QMetaObjectPrivate::originalClone(signal->mobj,iVar2);
  }
  iVar3 = 0;
  for (pQVar1 = (signal->mobj->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
      pQVar1 = (pQVar1->d).superdata.direct) {
    iVar3 = iVar3 + (pQVar1->d).data[0xd];
  }
  uVar4 = (ulong)((uint)this & 0xfffffff8) % 0x418;
  this_00 = (QBasicMutex *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar4);
  if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar4) == 0) {
    LOCK();
    bVar5 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar5) {
      (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar5) goto LAB_002b6992;
  }
  QBasicMutex::lockInternal(this_00);
LAB_002b6992:
  bVar5 = QObjectPrivate::isSignalConnected(this_01,iVar3 + iVar2,true);
  LOCK();
  copy = (this_00->d_ptr)._q_value._M_b._M_p;
  (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(this_00,copy);
  }
  return bVar5;
}

Assistant:

bool QObject::isSignalConnected(const QMetaMethod &signal) const
{
    Q_D(const QObject);
    if (!signal.mobj)
        return false;

    Q_ASSERT_X(signal.mobj->cast(this) && signal.methodType() == QMetaMethod::Signal,
               "QObject::isSignalConnected" , "the parameter must be a signal member of the object");
    uint signalIndex = signal.relativeMethodIndex();

    if (signal.data.flags() & MethodCloned)
        signalIndex = QMetaObjectPrivate::originalClone(signal.mobj, signalIndex);

    signalIndex += QMetaObjectPrivate::signalOffset(signal.mobj);

    QMutexLocker locker(signalSlotLock(this));
    return d->isSignalConnected(signalIndex, true);
}